

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

int test_mp_read_typed(void)

{
  char *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint extraout_EAX;
  uint extraout_EAX_00;
  int extraout_EAX_01;
  float fVar5;
  mp_type mVar6;
  double dVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  bool is_ok;
  bool is_ok_00;
  bool is_ok_01;
  bool is_ok_02;
  bool is_ok_03;
  bool is_ok_04;
  bool is_ok_05;
  bool is_ok_06;
  bool is_ok_07;
  bool is_ok_08;
  bool is_ok_09;
  bool is_ok_10;
  bool is_ok_11;
  bool is_ok_12;
  bool is_ok_13;
  bool is_ok_14;
  bool is_ok_15;
  bool is_ok_16;
  bool is_ok_17;
  bool is_ok_18;
  bool is_ok_19;
  bool is_ok_20;
  bool is_ok_21;
  bool is_ok_22;
  bool is_ok_23;
  bool is_ok_24;
  bool is_ok_25;
  bool is_ok_26;
  bool is_ok_27;
  bool is_ok_28;
  bool is_ok_29;
  bool is_ok_30;
  bool is_ok_31;
  bool is_ok_32;
  bool is_ok_33;
  bool is_ok_34;
  bool is_ok_35;
  bool is_ok_36;
  bool is_ok_37;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  ulong *puVar15;
  char *mp_nums_00;
  char *pcVar16;
  undefined1 uVar17;
  uint uVar18;
  _func_int_char_ptr_ptr_int_ptr *read_f;
  _func_int_char_ptr_ptr_long_ptr *read_f_00;
  int64_t k;
  char *data;
  char cVar19;
  int i_1;
  uint uVar20;
  ulong *puVar21;
  int i;
  undefined8 unaff_R14;
  char *__maxlen;
  long lVar23;
  char *pcVar24;
  bool bVar25;
  float num1;
  float num1_00;
  double num1_01;
  double num1_02;
  char mp_nums [16] [16];
  char str [256];
  byte *pbStack_288;
  char *pcStack_280;
  char *pcStack_278;
  char *pcStack_270;
  char *pcStack_268;
  char *pcStack_260;
  char *pcStack_258;
  char *pcStack_250;
  undefined8 local_248;
  char *local_240;
  byte local_238;
  undefined1 local_237 [2];
  undefined1 auStack_235 [6];
  undefined8 uStack_22f;
  undefined8 local_227;
  undefined1 local_218;
  undefined2 local_217;
  undefined1 local_215;
  undefined1 local_208;
  uint8_t local_1f8;
  undefined2 local_1f7;
  undefined2 uStack_1f5;
  undefined1 uStack_1f3;
  undefined4 local_1e8;
  undefined1 local_1e4;
  undefined1 local_1d8;
  char local_138 [256];
  char local_38 [8];
  byte *pbVar22;
  
  pcStack_250 = (char *)0x133ce8;
  _plan(0x2cc,true);
  pcStack_250 = (char *)0x133cf7;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x133d0c;
  printf("# *** %s ***\n","test_mp_read_typed");
  pcStack_250 = (char *)0x133d1b;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0xc,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok);
  pcStack_250 = (char *)0x133d2a;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0x7f,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_00);
  pcStack_250 = (char *)0x133d36;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0x80,(_func_int_char_ptr_ptr_char_ptr *)0x0,is_ok_01);
  pcStack_250 = (char *)0x133d45;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0xc,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_02);
  pcStack_250 = (char *)0x133d54;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0x80,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_03);
  pcStack_250 = (char *)0x133d60;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0x81,(_func_int_char_ptr_ptr_char_ptr *)0x0,is_ok_04);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  __maxlen = (char *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  pcStack_250 = (char *)0x133db2;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%f",0xbf33a92a40000000);
  pcVar14 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x133dd6;
  iVar4 = snprintf(pcVar14,(size_t)(local_38 + -(long)pcVar14)," into ");
  pcStack_250 = (char *)0x133df5;
  snprintf(pcVar14 + iVar4,(size_t)(local_38 + -(long)(pcVar14 + iVar4)),"int%zu_t",8);
  pcStack_250 = (char *)0x133dfd;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x133e16;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x133e26;
  fputs(local_138,_stdout);
  data = (char *)0xa;
  pcStack_250 = (char *)0x133e33;
  fputc(10,_stdout);
  pcVar13 = (char *)((long)&uStack_22f + 7);
  local_238 = 0xca;
  _local_237 = CONCAT44(auStack_235._2_4_,0x52499db9);
  uStack_22f._7_1_ = 0xcb;
  local_227 = 0x402aa933bf;
  pcVar16 = (char *)&local_238;
  do {
    bVar2 = *pcVar16;
    uVar8 = (ulong)bVar2;
    mVar6 = mp_type_hint[uVar8];
    if (mVar6 == MP_UINT) {
      switch(bVar2) {
      case 0xcc:
        uVar8 = (ulong)(byte)pcVar16[1];
        break;
      case 0xcd:
        uVar8 = (ulong)(ushort)(*(ushort *)(pcVar16 + 1) << 8 | *(ushort *)(pcVar16 + 1) >> 8);
        break;
      case 0xce:
        uVar20 = *(uint *)(pcVar16 + 1);
        uVar8 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        break;
      case 0xcf:
        uVar8 = *(ulong *)(pcVar16 + 1);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        break;
      default:
        if ((char)bVar2 < '\0') {
          pcStack_250 = (char *)0x135d39;
          test_mp_read_typed();
          goto LAB_00135d39;
        }
      }
      if (uVar8 != 0) goto LAB_00135e74;
LAB_00133fb4:
      if (bVar2 - 0xcc < 8) {
        iVar4 = (*(code *)(&DAT_00140a78 + *(int *)(&DAT_00140a78 + (ulong)(bVar2 - 0xcc) * 4)))();
        return iVar4;
      }
      if ((char)bVar2 < -0x20) {
        iVar4 = 1;
        pcVar14 = pcVar16;
      }
      else {
        iVar4 = 0;
        pcVar14 = pcVar16 + 1;
      }
    }
    else if (mVar6 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00135d93;
      uVar20 = *(uint *)(pcVar16 + 1);
      fVar5 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      iVar4 = 1;
      if ((fVar5 != -0.0003) || (pcVar14 = pcVar16, NAN(fVar5))) goto LAB_00135e6f;
    }
    else {
      if (mVar6 == MP_INT) {
        switch(bVar2) {
        case 0xd0:
          uVar8 = (ulong)pcVar16[1];
          break;
        case 0xd1:
          uVar8 = (ulong)(short)(*(ushort *)(pcVar16 + 1) << 8 | *(ushort *)(pcVar16 + 1) >> 8);
          break;
        case 0xd2:
          uVar20 = *(uint *)(pcVar16 + 1);
          uVar8 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                              uVar20 << 0x18);
          break;
        case 0xd3:
          uVar8 = *(ulong *)(pcVar16 + 1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          break;
        default:
          goto switchD_00133eac_default;
        }
        if (uVar8 == 0) goto LAB_00133fb4;
        goto LAB_00135efb;
      }
      if (bVar2 != 0xcb) goto LAB_00135e41;
      uVar8 = *(ulong *)(pcVar16 + 1);
      dVar7 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
      iVar4 = 1;
      if ((dVar7 != -0.0003000000142492354) || (pcVar14 = pcVar16, NAN(dVar7))) goto LAB_00135e6a;
    }
    pcStack_250 = (char *)0x134096;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    data = (char *)(ulong)(pcVar14 == pcVar16);
    pcStack_250 = (char *)0x1340b8;
    _ok((uint)(pcVar14 == pcVar16),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    cVar19 = (char)__maxlen;
    __maxlen = (char *)0x0;
    pcVar16 = pcVar13;
  } while (cVar19 != '\0');
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcStack_250 = (char *)0x13410a;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%lf",0x405edccccccccccd);
  pcVar16 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x134136;
  iVar4 = snprintf(pcVar16,(size_t)(local_38 + -(long)pcVar16)," into ");
  pcStack_250 = (char *)0x134155;
  snprintf(pcVar16 + iVar4,(size_t)(local_38 + -(long)(pcVar16 + iVar4)),"int%zu_t",8);
  pcStack_250 = (char *)0x134164;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x13417d;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x13418d;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x13419a;
  fputc(10,_stdout);
  local_248._4_4_ = MP_DOUBLE;
  pcStack_250 = (char *)0x1341f5;
  _ok(1,"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x737,
      "check failure for code 0x%02X",0xffffffcb);
  pcStack_250 = "\x0f\x10\x05\x0f\f\x02";
  _ok(1,"mp_num_pos2 == mp_nums[i]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x738,
      "check position");
  builtin_strncpy(local_138 + 0x13,"eading ",8);
  builtin_strncpy(local_138,"ensure failure of r",0x13);
  pcStack_250 = (char *)0x13424d;
  snprintf(local_138 + 0x1a,0xe6,"int%zu_t",8);
  pcStack_250 = (char *)0x13425c;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x13427b;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x13428b;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x134298;
  fputc(10,_stdout);
  local_238 = 0x91;
  uStack_22f._7_1_ = 0x81;
  local_218 = 0xa3;
  local_217 = 0x6261;
  local_215 = 99;
  local_208 = 0xc3;
  local_248._3_1_ = '\0';
  local_1f7._0_1_ = 3;
  local_1f7._0_1_ = 3;
  local_1f8 = 199;
  local_1f7._1_1_ = 1;
  uStack_1f3 = 99;
  uStack_1f5 = 0x6261;
  local_1e8 = 0x626103c4;
  local_1e4 = 99;
  local_1d8 = 0xc0;
  lVar23 = 7;
  lVar12 = 0;
  pcVar16 = (char *)&local_248;
  do {
    pcVar13 = pcVar16 + 0x10;
    lVar9 = lVar12 * 0x10;
    cVar19 = *pcVar13;
    switch(cVar19) {
    case -0x34:
      uVar8 = (ulong)(byte)pcVar16[0x11];
      pcVar14 = pcVar16 + 0x12;
      break;
    case -0x33:
      pcVar14 = auStack_235 + lVar9;
      uVar8 = (ulong)(ushort)(*(ushort *)(pcVar16 + 0x11) << 8 | *(ushort *)(pcVar16 + 0x11) >> 8);
      break;
    case -0x32:
      uVar20 = *(uint *)(pcVar16 + 0x11);
      uVar8 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      pcVar14 = auStack_235 + lVar9 + 2;
      break;
    case -0x31:
      uVar8 = *(ulong *)(pcVar16 + 0x11);
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      pcVar14 = (char *)(&uStack_22f + lVar12 * 2);
      break;
    case -0x30:
      pcVar14 = pcVar16 + 0x12;
      goto LAB_001343ca;
    case -0x2f:
      pcVar14 = pcVar16 + 0x13;
      uVar8 = (ulong)(short)(*(ushort *)(pcVar16 + 0x11) << 8 | *(ushort *)(pcVar16 + 0x11) >> 8);
      goto LAB_001343b3;
    case -0x2e:
      uVar20 = *(uint *)(pcVar16 + 0x11);
      pcVar14 = auStack_235 + lVar9 + 2;
      uVar8 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
      goto LAB_001343b3;
    case -0x2d:
      uVar8 = *(ulong *)(pcVar16 + 0x11);
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      pcVar14 = (char *)(&uStack_22f + lVar12 * 2);
LAB_001343b3:
      if ((long)(char)uVar8 == uVar8) goto LAB_001343ca;
      goto LAB_0013442a;
    default:
      if (-0x21 < cVar19) {
        pcVar14 = local_237 + lVar9;
        goto LAB_001343ca;
      }
      goto LAB_0013442a;
    }
    if (uVar8 < 0x80) {
LAB_001343ca:
      iVar4 = 0;
    }
    else {
LAB_0013442a:
      iVar4 = 1;
      pcVar14 = pcVar13;
    }
    pcStack_250 = (char *)0x1343ef;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)cVar19);
    pcStack_250 = (char *)0x134418;
    _ok((uint)(pcVar13 == pcVar14),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)cVar19);
    lVar12 = lVar12 + 1;
    lVar23 = lVar23 + -1;
    pcVar16 = pcVar13;
  } while (lVar23 != 0);
  pcStack_250 = (char *)0x134443;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x7b,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_05);
  pcStack_250 = (char *)0x134452;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x7fff,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_06);
  pcStack_250 = (char *)0x13445e;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x8000,(_func_int_char_ptr_ptr_short_ptr *)0x0,is_ok_07);
  pcStack_250 = (char *)0x13446d;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x7b,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_08);
  pcStack_250 = (char *)0x13447c;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x8000,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_09);
  pcStack_250 = (char *)0x134488;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x8001,(_func_int_char_ptr_ptr_short_ptr *)0x0,is_ok_10);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  __maxlen = (char *)((long)&UINT_00141100 + 1);
  pcStack_250 = (char *)0x1344ca;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%f",0xbf60624de0000000);
  pcVar16 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x1344f6;
  iVar4 = snprintf(pcVar16,(size_t)(local_38 + -(long)pcVar16)," into ");
  pcStack_250 = (char *)0x134515;
  snprintf(pcVar16 + iVar4,(size_t)(local_38 + -(long)(pcVar16 + iVar4)),"int%zu_t",0x10);
  pcVar14 = &stdout;
  pcStack_250 = (char *)0x134524;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x13453d;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x13454d;
  fputs(local_138,_stdout);
  data = (char *)0xa;
  pcStack_250 = (char *)0x13455a;
  fputc(10,_stdout);
  pcVar16 = (char *)&local_238;
  local_238 = 0xca;
  _local_237 = CONCAT44(auStack_235._2_4_,0x6f1203bb);
  uStack_22f._7_1_ = 0xcb;
  local_227 = 0xe04d6260bf;
  pcVar13 = "mp_num_pos2 == mp_nums[i]";
  do {
    bVar2 = *pcVar16;
    uVar8 = (ulong)bVar2;
    mVar6 = mp_type_hint[uVar8];
    if (mVar6 == MP_UINT) {
      switch(bVar2) {
      case 0xcc:
        uVar8 = (ulong)(byte)pcVar16[1];
        break;
      case 0xcd:
        uVar8 = (ulong)(ushort)(*(ushort *)(pcVar16 + 1) << 8 | *(ushort *)(pcVar16 + 1) >> 8);
        break;
      case 0xce:
        uVar20 = *(uint *)(pcVar16 + 1);
        uVar8 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        break;
      case 0xcf:
        uVar8 = *(ulong *)(pcVar16 + 1);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        break;
      default:
        if ((char)bVar2 < '\0') goto LAB_00135d39;
      }
      if (uVar8 != 0) goto LAB_00135e83;
LAB_001346e0:
      if (bVar2 - 0xcc < 8) {
        iVar4 = (*(code *)(&DAT_00140ad8 + *(int *)(&DAT_00140ad8 + (ulong)(bVar2 - 0xcc) * 4)))();
        return iVar4;
      }
      if ((char)bVar2 < -0x20) {
        iVar4 = 1;
        pcVar14 = pcVar16;
      }
      else {
        iVar4 = 0;
        pcVar14 = pcVar16 + 1;
      }
    }
    else if (mVar6 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00135d93;
      uVar20 = *(uint *)(pcVar16 + 1);
      fVar5 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      iVar4 = 1;
      if ((fVar5 != -0.002) || (pcVar14 = pcVar16, NAN(fVar5))) goto LAB_00135e7e;
    }
    else {
      if (mVar6 == MP_INT) {
        switch(bVar2) {
        case 0xd0:
          uVar8 = (ulong)pcVar16[1];
          break;
        case 0xd1:
          uVar8 = (ulong)(short)(*(ushort *)(pcVar16 + 1) << 8 | *(ushort *)(pcVar16 + 1) >> 8);
          break;
        case 0xd2:
          uVar20 = *(uint *)(pcVar16 + 1);
          uVar8 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                              uVar20 << 0x18);
          break;
        case 0xd3:
          uVar8 = *(ulong *)(pcVar16 + 1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          break;
        default:
          goto switchD_001345d8_default;
        }
        if (uVar8 == 0) goto LAB_001346e0;
        goto LAB_00135f05;
      }
      if (bVar2 != 0xcb) goto LAB_00135e41;
      uVar8 = *(ulong *)(pcVar16 + 1);
      dVar7 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
      iVar4 = 1;
      if ((dVar7 != -0.0020000000949949026) || (pcVar14 = pcVar16, NAN(dVar7))) goto LAB_00135e79;
    }
    pcStack_250 = (char *)0x1347a7;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    data = (char *)(ulong)(pcVar14 == pcVar16);
    pcStack_250 = (char *)0x1347c5;
    _ok((uint)(pcVar14 == pcVar16),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    pcVar16 = (char *)((long)&uStack_22f + 7);
    cVar19 = (char)__maxlen;
    __maxlen = (char *)0x0;
  } while (cVar19 != '\0');
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_250 = (char *)0x134819;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%lf",0x4028b0a3d70a3d71);
  pcVar16 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x134845;
  iVar4 = snprintf(pcVar16,(size_t)(local_38 + -(long)pcVar16)," into ");
  pcStack_250 = (char *)0x134864;
  snprintf(pcVar16 + iVar4,(size_t)(local_38 + -(long)(pcVar16 + iVar4)),"int%zu_t",0x10);
  pcStack_250 = (char *)0x134873;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x13488c;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x13489c;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x1348a9;
  fputc(10,_stdout);
  if (local_248._4_4_ == MP_UINT) goto LAB_00135ece;
  if (local_248._4_4_ == MP_FLOAT) goto LAB_00135d93;
  if (local_248._4_4_ == MP_INT) goto LAB_00135ea6;
  pcStack_250 = (char *)0x1348f7;
  _ok(1,"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x737,
      "check failure for code 0x%02X",0xffffffcb);
  pcStack_250 = (char *)0x134919;
  _ok(1,"mp_num_pos2 == mp_nums[i]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x738,
      "check position");
  builtin_strncpy(local_138 + 0x13,"eading ",8);
  builtin_strncpy(local_138,"ensure failure of r",0x13);
  pcStack_250 = (char *)0x13494f;
  snprintf(local_138 + 0x1a,0xe6,"int%zu_t",0x10);
  pcStack_250 = (char *)0x13495e;
  _space((FILE *)_stdout);
  lVar12 = 1;
  pcStack_250 = (char *)0x13497c;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x13498c;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x134999;
  fputc(10,_stdout);
  local_238 = 0x91;
  uStack_22f._7_1_ = 0x81;
  local_218 = 0xa3;
  local_217 = 0x6261;
  local_215 = 99;
  local_208 = 0xc3;
  local_1f8 = local_248._3_1_;
  if (local_248._3_1_ == '\0') {
    local_1f7._0_1_ = 3;
    local_1f8 = 199;
    lVar12 = 2;
  }
  (&local_1f8)[lVar12] = '\x01';
  *(undefined1 *)((long)&uStack_1f5 + lVar12) = 99;
  *(undefined2 *)((long)&local_1f7 + lVar12) = 0x6261;
  local_1e8 = 0x626103c4;
  local_1e4 = 99;
  local_1d8 = 0xc0;
  lVar12 = 0;
  pcVar16 = (char *)0x0;
  do {
    lVar23 = (long)pcVar16 * 0x10;
    pbVar22 = &local_238 + lVar12;
    bVar2 = *pbVar22;
    switch(bVar2) {
    case 0xcc:
      pbVar10 = local_237 + lVar23 + 1;
      break;
    case 0xcd:
      pbVar10 = auStack_235 + lVar12;
      uVar8 = (ulong)(ushort)(*(ushort *)(local_237 + lVar12) << 8 |
                             *(ushort *)(local_237 + lVar12) >> 8);
      goto LAB_00134a8c;
    case 0xce:
      uVar20 = *(uint *)(local_237 + lVar12);
      uVar8 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      pbVar10 = auStack_235 + lVar23 + 2;
      goto LAB_00134a8c;
    case 0xcf:
      uVar8 = *(ulong *)(local_237 + lVar12);
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      pbVar10 = (byte *)(&uStack_22f + (long)pcVar16 * 2);
LAB_00134a8c:
      if (uVar8 < 0x8000) break;
LAB_00134b29:
      iVar4 = 1;
      pbVar10 = pbVar22;
      goto LAB_00134aca;
    case 0xd0:
      pbVar10 = local_237 + lVar12 + 1;
      break;
    case 0xd1:
      pbVar10 = auStack_235 + lVar23;
      break;
    case 0xd2:
      pbVar10 = auStack_235 + lVar12 + 2;
      uVar20 = *(uint *)(local_237 + lVar12);
      uVar8 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
      goto LAB_00134ab1;
    case 0xd3:
      uVar8 = *(ulong *)(local_237 + lVar12);
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      pbVar10 = (byte *)(&uStack_22f + (long)pcVar16 * 2);
LAB_00134ab1:
      if ((long)(short)uVar8 == uVar8) break;
      goto LAB_00134b29;
    default:
      if (-0x21 < (char)bVar2) {
        pbVar10 = local_237 + lVar23;
        break;
      }
      goto LAB_00134b29;
    }
    iVar4 = 0;
LAB_00134aca:
    pcStack_250 = (char *)0x134aed;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar13 = "pos == bad_types[i]";
    pcStack_250 = (char *)0x134b16;
    _ok((uint)(pbVar22 == pbVar10),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar16 = pcVar16 + 1;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x70);
  pcStack_250 = (char *)0x134b47;
  test_read_num<int,int,int(*)(char_const**,int*)>
            (0x7b,(_func_int_char_ptr_ptr_int_ptr *)pcVar13,is_ok_11);
  pcStack_250 = (char *)0x134b51;
  test_read_num<int,int,int(*)(char_const**,int*)>
            (0x3039,(_func_int_char_ptr_ptr_int_ptr *)pcVar13,is_ok_12);
  pcStack_250 = (char *)0x134b5b;
  test_read_num<int,int,int(*)(char_const**,int*)>
            (0x7fffffff,(_func_int_char_ptr_ptr_int_ptr *)pcVar13,is_ok_13);
  read_f = (_func_int_char_ptr_ptr_int_ptr *)0x0;
  pcStack_250 = (char *)0x134b67;
  test_read_num<int,long,int(*)(char_const**,int*)>
            (0x80000000,(_func_int_char_ptr_ptr_int_ptr *)0x0,is_ok_14);
  pcStack_250 = (char *)0x134b71;
  test_read_num<int,int,int(*)(char_const**,int*)>(-0x7b,read_f,is_ok_15);
  pcStack_250 = (char *)0x134b7b;
  test_read_num<int,int,int(*)(char_const**,int*)>(-0x3039,read_f,is_ok_16);
  pcStack_250 = (char *)0x134b8c;
  test_read_num<int,long,int(*)(char_const**,int*)>
            (-0x80000000,(_func_int_char_ptr_ptr_int_ptr *)0x1,is_ok_17);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_250 = (char *)0x134bcd;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%lld",0xffffffff7fffffff);
  pcVar13 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x134bf9;
  iVar4 = snprintf(pcVar13,(size_t)(local_38 + -(long)pcVar13)," into ");
  pcStack_250 = (char *)0x134c18;
  snprintf(pcVar13 + iVar4,(size_t)(local_38 + -(long)(pcVar13 + iVar4)),"int%zu_t",0x20);
  pcStack_250 = (char *)0x134c27;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x134c40;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x134c50;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x134c5d;
  fputc(10,_stdout);
  pcVar13 = (char *)&local_238;
  pcStack_250 = (char *)0x134c6d;
  data = pcVar13;
  uVar20 = test_encode_int_all_sizes((char (*) [16])pcVar13,-0x80000001);
  if (0 < (int)uVar20) {
    pcVar14 = (char *)((ulong)uVar20 << 4);
    pcVar24 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    __maxlen = "mp_num_pos2 == mp_nums[i]";
    mp_nums_00 = "check position";
    pcVar16 = (char *)0x0;
    do {
      bVar2 = (&local_238)[(long)pcVar16];
      uVar20 = (uint)bVar2;
      mVar6 = mp_type_hint[bVar2];
      if (mVar6 == MP_UINT) {
        if (bVar2 == 0xcf) {
          if (*(long *)(local_237 + (long)pcVar16) == -0x8000000001) goto LAB_00134d3e;
        }
        else if ((2 < bVar2 - 0xcc) && ((char)bVar2 < '\0')) goto LAB_00135f23;
        pcStack_250 = (char *)0x135dcd;
        test_mp_read_typed();
        uVar20 = extraout_EAX_00;
LAB_00135dcd:
        if ((2 < (uVar20 & 0xff) - 0xd0) && ((byte)uVar20 < 0xe0)) goto LAB_00135f28;
LAB_00135de3:
        pcStack_250 = (char *)0x135de8;
        test_mp_read_typed();
        bVar2 = extraout_AL_00;
        goto LAB_00135de8;
      }
      if (mVar6 == MP_FLOAT) {
        if (bVar2 != 0xca) goto LAB_00135d93;
        uVar20 = *(uint *)(local_237 + (long)pcVar16);
        fVar5 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        if ((fVar5 != -2.1474836e+09) || (NAN(fVar5))) goto LAB_00135e97;
      }
      else if (mVar6 == MP_INT) {
        if (bVar2 != 0xd3) goto LAB_00135dcd;
        if (*(long *)(local_237 + (long)pcVar16) != -0x8000000001) goto LAB_00135de3;
      }
      else {
        if (bVar2 != 0xcb) goto LAB_00135e41;
        uVar8 = *(ulong *)(local_237 + (long)pcVar16);
        dVar7 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                         (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                         (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
        if ((dVar7 != -2147483649.0) || (NAN(dVar7))) goto LAB_00135e9c;
      }
LAB_00134d3e:
      pcStack_250 = (char *)0x134d64;
      _ok(1,"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
      data = (char *)0x1;
      pcStack_250 = (char *)0x134d7e;
      _ok(1,"mp_num_pos2 == mp_nums[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x738,"check position");
      pcVar16 = pcVar16 + 0x10;
    } while (pcVar14 != pcVar16);
  }
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),1);
  pcStack_250 = (char *)0x134dcd;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%f",0xc059000000000000);
  pcVar14 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x134df9;
  iVar4 = snprintf(pcVar14,(long)local_38 - (long)pcVar14," into ");
  pcStack_250 = (char *)0x134e18;
  snprintf(pcVar14 + iVar4,(long)local_38 - (long)(pcVar14 + iVar4),"int%zu_t",0x20);
  pcStack_250 = (char *)0x134e27;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x134e40;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x134e50;
  fputs(local_138,_stdout);
  data = (char *)0xa;
  pcStack_250 = (char *)0x134e5d;
  fputc(10,_stdout);
  local_238 = 0xca;
  _local_237 = CONCAT44(auStack_235._2_4_,0xc8c2);
  uStack_22f._7_1_ = 0xcb;
  local_227 = 0x59c0;
  pcVar24 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcVar14 = "mp_num_pos2 == mp_nums[i]";
  mp_nums_00 = "check position";
  pcVar1 = pcVar13;
  __maxlen = local_38;
  do {
    pcVar13 = pcVar1;
    bVar2 = *pcVar13;
    mVar6 = mp_type_hint[bVar2];
    local_240 = pcVar13;
    if (mVar6 == MP_INT) {
      uVar8 = (ulong)(bVar2 - 0xd0);
      switch(uVar8) {
      case 0:
        uVar11 = (ulong)pcVar13[1];
        break;
      case 1:
        uVar11 = (ulong)(short)(*(ushort *)(pcVar13 + 1) << 8 | *(ushort *)(pcVar13 + 1) >> 8);
        break;
      case 2:
        uVar20 = *(uint *)(pcVar13 + 1);
        uVar11 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
        break;
      case 3:
        uVar11 = *(ulong *)(pcVar13 + 1);
        uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                 (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                 (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                 (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
        break;
      default:
        if (0xdf < bVar2) goto LAB_00135ef1;
        goto LAB_00135f32;
      }
      if (uVar11 == 0xffffffffffffff9c) {
        iVar4 = (*(code *)(&DAT_00140b28 + *(int *)(&DAT_00140b28 + uVar8 * 4)))();
        return iVar4;
      }
LAB_00135ef1:
      pcStack_250 = (char *)0x135ef6;
      test_mp_read_typed();
switchD_00133eac_default:
      pcVar24 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      mp_nums_00 = "check position";
      if ((byte)uVar8 < 0xe0) goto LAB_00135f37;
LAB_00135efb:
      pcStack_250 = (char *)0x135f00;
      test_mp_read_typed();
switchD_001345d8_default:
      pcVar24 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      mp_nums_00 = "check position";
      if (0xdf < (byte)uVar8) {
LAB_00135f05:
        bVar2 = (byte)uVar8;
        pcVar24 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        mp_nums_00 = "check position";
        pcStack_250 = (char *)0x135f0a;
        test_mp_read_typed();
        goto switchD_0013569b_default;
      }
      goto LAB_00135f3c;
    }
    if (mVar6 == MP_FLOAT) {
      if (bVar2 == 0xca) {
        uVar20 = *(uint *)(pcVar13 + 1);
        fVar5 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        if ((fVar5 == -100.0) && (!NAN(fVar5))) goto LAB_00134fc0;
LAB_00135e65:
        pcStack_250 = (char *)0x135e6a;
        test_mp_read_typed();
LAB_00135e6a:
        pcStack_250 = (char *)0x135e6f;
        test_mp_read_typed();
LAB_00135e6f:
        pcStack_250 = (char *)0x135e74;
        test_mp_read_typed();
LAB_00135e74:
        pcStack_250 = (char *)0x135e79;
        test_mp_read_typed();
LAB_00135e79:
        pcStack_250 = (char *)0x135e7e;
        test_mp_read_typed();
LAB_00135e7e:
        pcStack_250 = (char *)0x135e83;
        test_mp_read_typed();
LAB_00135e83:
        pcStack_250 = (char *)0x135e88;
        test_mp_read_typed();
        goto LAB_00135e88;
      }
      goto LAB_00135d93;
    }
    if (mVar6 == MP_UINT) goto LAB_00135f19;
    if (bVar2 != 0xcb) goto LAB_00135e41;
    uVar8 = *(ulong *)(pcVar13 + 1);
    dVar7 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
    if ((dVar7 != -100.0) || (NAN(dVar7))) {
      pcStack_250 = (char *)0x135e65;
      test_mp_read_typed();
      goto LAB_00135e65;
    }
LAB_00134fc0:
    pcStack_250 = (char *)0x134fe1;
    _ok(1,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    data = (char *)0x1;
    pcStack_250 = (char *)0x134fff;
    _ok(1,"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    cVar19 = (char)pcVar16;
    pcVar16 = (char *)0x0;
    pcVar1 = (char *)((long)&uStack_22f + 7);
    __maxlen = pcVar13;
  } while (cVar19 != '\0');
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_250 = (char *)0x135053;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%lf",0x3ff3c083126e978d);
  pcVar16 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x13507f;
  iVar4 = snprintf(pcVar16,(size_t)(local_38 + -(long)pcVar16)," into ");
  pcStack_250 = (char *)0x13509e;
  snprintf(pcVar16 + iVar4,(size_t)(local_38 + -(long)(pcVar16 + iVar4)),"int%zu_t",0x20);
  pcStack_250 = (char *)0x1350ad;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x1350c6;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x1350d6;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x1350e3;
  fputc(10,_stdout);
  if (local_248._4_4_ == MP_UINT) goto LAB_00135ece;
  if (local_248._4_4_ == MP_FLOAT) goto LAB_00135d93;
  if (local_248._4_4_ == MP_INT) goto LAB_00135ea6;
  pcStack_250 = (char *)0x135131;
  _ok(1,"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x737,
      "check failure for code 0x%02X",0xffffffcb);
  pcStack_250 = (char *)0x135153;
  _ok(1,"mp_num_pos2 == mp_nums[i]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x738,
      "check position");
  builtin_strncpy(local_138 + 0x13,"eading ",8);
  builtin_strncpy(local_138,"ensure failure of r",0x13);
  pcStack_250 = (char *)0x135189;
  snprintf(local_138 + 0x1a,0xe6,"int%zu_t",0x20);
  pcStack_250 = (char *)0x135198;
  _space((FILE *)_stdout);
  lVar12 = 1;
  pcStack_250 = (char *)0x1351b7;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x1351c7;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x1351d4;
  fputc(10,_stdout);
  local_238 = 0x91;
  uStack_22f._7_1_ = 0x81;
  local_218 = 0xa3;
  local_217 = 0x6261;
  local_215 = 99;
  local_208 = 0xc3;
  local_1f8 = local_248._3_1_;
  if (local_248._3_1_ == '\0') {
    local_1f7._0_1_ = 3;
    local_1f8 = 199;
    lVar12 = 2;
  }
  (&local_1f8)[lVar12] = '\x01';
  *(undefined1 *)((long)&uStack_1f5 + lVar12) = 99;
  *(undefined2 *)((long)&local_1f7 + lVar12) = 0x6261;
  local_1e8 = 0x626103c4;
  local_1e4 = 99;
  local_1d8 = 0xc0;
  lVar23 = 7;
  lVar12 = 0;
  puVar21 = &local_248;
  do {
    puVar15 = puVar21 + 2;
    bVar2 = (byte)*puVar15;
    if (7 < bVar2 - 0xcc) {
      bVar25 = (char)bVar2 < -0x20;
      puVar21 = (ulong *)((long)puVar21 + 0x11);
      if ((char)bVar2 < -0x20) {
        puVar21 = puVar15;
      }
      goto LAB_001352e5;
    }
    lVar9 = lVar12 * 0x10;
    switch((uint)bVar2) {
    default:
      puVar21 = (ulong *)(local_237 + lVar9 + 1);
      break;
    case 0xcd:
    case 0xd1:
      puVar21 = (ulong *)(auStack_235 + lVar9);
      break;
    case 0xce:
      uVar20 = *(uint *)((long)puVar21 + 0x11);
      uVar8 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      puVar21 = (ulong *)((long)puVar21 + 0x15);
      goto LAB_001352cf;
    case 0xcf:
      uVar8 = *(ulong *)((long)puVar21 + 0x11);
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      puVar21 = &uStack_22f + lVar12 * 2;
LAB_001352cf:
      bVar25 = 0x7fffffff < uVar8;
      if (0x7fffffff < uVar8) {
        puVar21 = puVar15;
      }
      goto LAB_001352e5;
    case 0xd2:
      puVar21 = (ulong *)(auStack_235 + lVar9 + 2);
      break;
    case 0xd3:
      uVar8 = *(ulong *)((long)puVar21 + 0x11);
      bVar25 = (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
               uVar8 << 0x38) - 0x80000000 < 0xffffffff00000000;
      puVar21 = (ulong *)((ulong)!bVar25 * 9 + (long)puVar15);
      goto LAB_001352e5;
    }
    bVar25 = false;
LAB_001352e5:
    pcStack_250 = (char *)0x13530b;
    _ok((uint)bVar25,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar16 = "pos == bad_types[i]";
    pcStack_250 = (char *)0x135334;
    _ok((uint)(puVar15 == puVar21),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    lVar12 = lVar12 + 1;
    lVar23 = lVar23 + -1;
    puVar21 = puVar15;
  } while (lVar23 != 0);
  pcStack_250 = (char *)0x13535e;
  test_read_num<long,int,int(*)(char_const**,long*)>
            (0x7b,(_func_int_char_ptr_ptr_long_ptr *)pcVar16,is_ok_18);
  pcStack_250 = (char *)0x135368;
  test_read_num<long,int,int(*)(char_const**,long*)>
            (0x3039,(_func_int_char_ptr_ptr_long_ptr *)pcVar16,is_ok_19);
  pcStack_250 = (char *)0x135372;
  test_read_num<long,int,int(*)(char_const**,long*)>
            (0x75bcd15,(_func_int_char_ptr_ptr_long_ptr *)pcVar16,is_ok_20);
  pcStack_250 = (char *)0x13538a;
  test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
            (0x7fffffffffffffff,(_func_int_char_ptr_ptr_long_ptr *)0x1,is_ok_21);
  read_f_00 = (_func_int_char_ptr_ptr_long_ptr *)0x0;
  pcStack_250 = (char *)0x135395;
  test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
            (0x8000000000000000,(_func_int_char_ptr_ptr_long_ptr *)0x0,is_ok_22);
  pcStack_250 = (char *)0x13539f;
  test_read_num<long,int,int(*)(char_const**,long*)>(-0x7b,read_f_00,is_ok_23);
  pcStack_250 = (char *)0x1353a9;
  test_read_num<long,int,int(*)(char_const**,long*)>(-0x3039,read_f_00,is_ok_24);
  pcStack_250 = (char *)0x1353b3;
  test_read_num<long,int,int(*)(char_const**,long*)>(-0x75bcd15,read_f_00,is_ok_25);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_250 = (char *)0x1353ed;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%lld",0x8000000000000001);
  pcVar16 = local_138 + (long)iVar4 + 0xe;
  pcVar24 = local_38;
  pcStack_250 = (char *)0x135419;
  iVar4 = snprintf(pcVar16,(long)pcVar24 - (long)pcVar16," into ");
  pcStack_250 = (char *)0x135438;
  snprintf(pcVar16 + iVar4,(long)pcVar24 - (long)(pcVar16 + iVar4),"int%zu_t",0x40);
  pcStack_250 = (char *)0x135447;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x135460;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x135470;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x13547d;
  fputc(10,_stdout);
  mp_nums_00 = (char *)&local_238;
  pcStack_250 = (char *)0x13548d;
  data = mp_nums_00;
  uVar20 = test_encode_int_all_sizes((char (*) [16])mp_nums_00,-0x7fffffffffffffff);
  if (0 < (int)uVar20) {
    __maxlen = (char *)((ulong)uVar20 << 4);
    pcVar24 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcVar14 = "(int64_t)num1 == (int64_t)num2";
    pcVar16 = "check int number";
    pcVar13 = (char *)0x0;
    do {
      bVar2 = (&local_238)[(long)pcVar13];
      uVar20 = (uint)bVar2;
      mVar6 = mp_type_hint[bVar2];
      if (mVar6 != MP_INT) goto LAB_00135d5e;
      if (bVar2 != 0xd3) goto LAB_00135d43;
      if (*(long *)(local_237 + (long)pcVar13) != 0x100000000000080) goto LAB_00135d59;
      pcStack_250 = (char *)0x135510;
      _ok(1,"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
      pcStack_250 = (char *)0x135532;
      _ok(1,"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      data = (char *)0x1;
      pcStack_250 = (char *)0x13554c;
      _ok(1,"(int64_t)num1 == (int64_t)num2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x746,"check int number");
      pcVar13 = pcVar13 + 0x10;
    } while (__maxlen != pcVar13);
  }
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcVar24 = (char *)CONCAT71((int7)((ulong)pcVar24 >> 8),1);
  pcStack_250 = (char *)0x13559b;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%f",0x4059000000000000);
  pcVar16 = local_138 + (long)iVar4 + 0xe;
  __maxlen = local_38;
  pcStack_250 = (char *)0x1355c7;
  iVar4 = snprintf(pcVar16,(long)__maxlen - (long)pcVar16," into ");
  pcStack_250 = (char *)0x1355e6;
  snprintf(pcVar16 + iVar4,(long)__maxlen - (long)(pcVar16 + iVar4),"int%zu_t",0x40);
  pcStack_250 = (char *)0x1355f5;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x13560e;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x13561e;
  fputs(local_138,_stdout);
  data = (char *)0xa;
  pcStack_250 = (char *)0x13562b;
  fputc(10,_stdout);
  local_238 = 0xca;
  _local_237 = CONCAT44(auStack_235._2_4_,0xc842);
  uStack_22f._7_1_ = 0xcb;
  local_227 = 0x5940;
  pcVar16 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcVar13 = "mp_num_pos2 == mp_nums[i]";
  pcVar14 = "check position";
  do {
    bVar2 = *mp_nums_00;
    uVar8 = (ulong)bVar2;
    mVar6 = mp_type_hint[uVar8];
    if (mVar6 == MP_UINT) {
      switch(bVar2) {
      case 0xcc:
        uVar8 = (ulong)(byte)mp_nums_00[1];
        break;
      case 0xcd:
        uVar8 = (ulong)(ushort)(*(ushort *)(mp_nums_00 + 1) << 8 | *(ushort *)(mp_nums_00 + 1) >> 8)
        ;
        break;
      case 0xce:
        uVar20 = *(uint *)(mp_nums_00 + 1);
        uVar8 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        break;
      case 0xcf:
        uVar8 = *(ulong *)(mp_nums_00 + 1);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        break;
      default:
        if ((char)bVar2 < '\0') goto LAB_00135d3e;
      }
      if (uVar8 != 100) goto LAB_00135e92;
LAB_0013578f:
      if (bVar2 - 0xcc < 8) {
        iVar4 = (*(code *)(&DAT_00140b78 + *(int *)(&DAT_00140b78 + (ulong)(bVar2 - 0xcc) * 4)))();
        return iVar4;
      }
      bVar25 = (char)bVar2 < -0x20;
      __maxlen = mp_nums_00 + 1;
      if ((char)bVar2 < -0x20) {
        __maxlen = mp_nums_00;
      }
    }
    else if (mVar6 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00135d93;
      uVar20 = *(uint *)(mp_nums_00 + 1);
      fVar5 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      bVar25 = true;
      if ((fVar5 != 100.0) || (__maxlen = mp_nums_00, NAN(fVar5))) goto LAB_00135e8d;
    }
    else {
      if (mVar6 == MP_INT) {
        switch(bVar2) {
        case 0xd0:
          uVar8 = (ulong)mp_nums_00[1];
          break;
        case 0xd1:
          uVar8 = (ulong)(short)(*(ushort *)(mp_nums_00 + 1) << 8 | *(ushort *)(mp_nums_00 + 1) >> 8
                                );
          break;
        case 0xd2:
          uVar20 = *(uint *)(mp_nums_00 + 1);
          uVar8 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                              uVar20 << 0x18);
          break;
        case 0xd3:
          uVar8 = *(ulong *)(mp_nums_00 + 1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          break;
        default:
          goto switchD_0013569b_default;
        }
        if (uVar8 == 100) goto LAB_0013578f;
        goto LAB_00135f0f;
      }
      if (bVar2 != 0xcb) goto LAB_00135e41;
      uVar8 = *(ulong *)(mp_nums_00 + 1);
      dVar7 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
      bVar25 = true;
      if ((dVar7 != 100.0) || (__maxlen = mp_nums_00, NAN(dVar7))) goto LAB_00135e88;
    }
    pcStack_250 = (char *)0x13580e;
    _ok((uint)bVar25,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    data = (char *)(ulong)(__maxlen == mp_nums_00);
    pcStack_250 = (char *)0x13582c;
    _ok((uint)(__maxlen == mp_nums_00),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    mp_nums_00 = (char *)((long)&uStack_22f + 7);
    cVar19 = (char)pcVar24;
    pcVar24 = (char *)0x0;
  } while (cVar19 != '\0');
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_250 = (char *)0x135891;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%lf",0xc015ba786c22680a);
  pcVar14 = local_138 + (long)iVar4 + 0xe;
  pcStack_250 = (char *)0x1358bd;
  iVar4 = snprintf(pcVar14,(size_t)(local_38 + -(long)pcVar14)," into ");
  __maxlen = local_38 + -(long)(pcVar14 + iVar4);
  pcStack_250 = (char *)0x1358dc;
  snprintf(pcVar14 + iVar4,(size_t)__maxlen,"int%zu_t",0x40);
  pcStack_250 = (char *)0x1358eb;
  _space((FILE *)_stdout);
  pcStack_250 = (char *)0x135904;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (char *)0x135914;
  fputs(local_138,_stdout);
  pcStack_250 = (char *)0x135921;
  fputc(10,_stdout);
  pcVar14 = (char *)&local_238;
  local_238 = 0xcb;
  _local_237 = 0xa68226c78ba15c0;
  local_240 = pcVar14;
  if (local_248._4_4_ == MP_INT) goto LAB_00135ea6;
  if (local_248._4_4_ == MP_FLOAT) goto LAB_00135d93;
  if (local_248._4_4_ != MP_UINT) {
    pcStack_250 = (char *)0x13598a;
    _ok(1,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",0xffffffcb);
    pcStack_250 = (char *)0x1359ac;
    _ok(1,"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    builtin_strncpy(local_138 + 0x13,"eading ",8);
    builtin_strncpy(local_138,"ensure failure of r",0x13);
    pcStack_250 = (char *)0x1359e2;
    snprintf(local_138 + 0x1a,0xe6,"int%zu_t",0x40);
    pcStack_250 = (char *)0x1359f1;
    _space((FILE *)_stdout);
    lVar12 = 1;
    pcStack_250 = (char *)0x135a10;
    fwrite("# ",2,1,_stdout);
    pcStack_250 = (char *)0x135a20;
    fputs(local_138,_stdout);
    pcStack_250 = (char *)0x135a2d;
    fputc(10,_stdout);
    local_238 = 0x91;
    uStack_22f._7_1_ = 0x81;
    local_218 = 0xa3;
    local_217 = 0x6261;
    local_215 = 99;
    local_208 = 0xc3;
    local_1f8 = local_248._3_1_;
    if (local_248._3_1_ == '\0') {
      local_1f7._0_1_ = 3;
      local_1f8 = 199;
      lVar12 = 2;
    }
    (&local_1f8)[lVar12] = '\x01';
    *(undefined1 *)((long)&uStack_1f5 + lVar12) = 99;
    *(undefined2 *)((long)&local_1f7 + lVar12) = 0x6261;
    local_1e8 = 0x626103c4;
    local_1e4 = 99;
    local_1d8 = 0xc0;
    lVar23 = 7;
    lVar12 = 0;
    do {
      bVar2 = *pcVar14;
      if (bVar2 - 0xcc < 8) {
        lVar9 = lVar12 * 0x10;
        switch((uint)bVar2) {
        default:
          pcVar16 = local_237 + lVar9 + 1;
          break;
        case 0xcd:
        case 0xd1:
          pcVar16 = auStack_235 + lVar9;
          break;
        case 0xce:
        case 0xd2:
          pcVar16 = auStack_235 + lVar9 + 2;
          break;
        case 0xcf:
          bVar25 = SUB41(((uint)*(ulong *)(pcVar14 + 1) & 0x80) >> 7,0);
          pcVar16 = pcVar14 + (ulong)((*(ulong *)(pcVar14 + 1) & 0x80) == 0) * 9;
          goto LAB_00135b0d;
        case 0xd3:
          pcVar16 = (char *)(&uStack_22f + lVar12 * 2);
        }
        bVar25 = false;
      }
      else {
        bVar25 = (char)bVar2 < -0x20;
        pcVar16 = pcVar14 + 1;
        if ((char)bVar2 < -0x20) {
          pcVar16 = pcVar14;
        }
      }
LAB_00135b0d:
      pcStack_250 = (char *)0x135b33;
      _ok((uint)bVar25,"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
      pcStack_250 = (char *)0x135b5c;
      _ok((uint)(pcVar14 == pcVar16),"pos == bad_types[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
      lVar12 = lVar12 + 1;
      pcVar14 = pcVar14 + 0x10;
      lVar23 = lVar23 + -1;
      if (lVar23 == 0) {
        pcStack_250 = (char *)0x135b91;
        test_read_num<double,int,int(*)(char_const**,double*)>(0x7b,mp_read_double,is_ok_26);
        pcStack_250 = (char *)0x135b9e;
        test_read_num<double,int,int(*)(char_const**,double*)>(0x3039,mp_read_double,is_ok_27);
        pcStack_250 = (char *)0x135bab;
        test_read_num<double,int,int(*)(char_const**,double*)>(0x75bcd15,mp_read_double,is_ok_28);
        pcStack_250 = (char *)0x135bc5;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                  (0x11f71fb0450,mp_read_double,true);
        pcStack_250 = (char *)0x135bdc;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                  (0x1b69b4bacd05f15,mp_read_double,false);
        pcStack_250 = (char *)0x135be9;
        test_read_num<double,int,int(*)(char_const**,double*)>(-0x7b,mp_read_double,is_ok_29);
        pcStack_250 = (char *)0x135bf6;
        test_read_num<double,int,int(*)(char_const**,double*)>(-0x3039,mp_read_double,is_ok_30);
        pcStack_250 = (char *)0x135c03;
        test_read_num<double,int,int(*)(char_const**,double*)>(-0x75bcd15,mp_read_double,is_ok_31);
        pcStack_250 = (char *)0x135c1d;
        test_read_num<double,long_long,int(*)(char_const**,double*)>
                  (-0x11f71fb0450,mp_read_double,true);
        uVar17 = 0x82;
        pcStack_250 = (char *)0x135c34;
        test_read_num<double,long_long,int(*)(char_const**,double*)>
                  (-0x1b69b4bacd05f15,mp_read_double,false);
        pcStack_250 = (char *)0x135c3c;
        test_read_num<double,float,int(*)(char_const**,double*)>(num1,mp_read_double,(bool)uVar17);
        pcStack_250 = (char *)0x135c44;
        test_read_num<double,double,int(*)(char_const**,double*)>
                  (num1_01,mp_read_double,(bool)uVar17);
        pcStack_250 = (char *)0x135c4c;
        test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>(mp_read_double);
        pcStack_250 = (char *)0x135c60;
        test_read_num<double,int,int(*)(char_const**,double*)>(0x7b,mp_read_double_lossy,is_ok_32);
        pcStack_250 = (char *)0x135c6d;
        test_read_num<double,int,int(*)(char_const**,double*)>(0x3039,mp_read_double_lossy,is_ok_33)
        ;
        pcStack_250 = (char *)0x135c7a;
        test_read_num<double,int,int(*)(char_const**,double*)>
                  (0x75bcd15,mp_read_double_lossy,is_ok_34);
        pcStack_250 = (char *)0x135c8a;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                  (0x11f71fb0450,mp_read_double_lossy,true);
        pcStack_250 = (char *)0x135c9a;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                  (0x1b69b4bacd05f15,mp_read_double_lossy,true);
        pcStack_250 = (char *)0x135ca7;
        test_read_num<double,int,int(*)(char_const**,double*)>(-0x7b,mp_read_double_lossy,is_ok_35);
        pcStack_250 = (char *)0x135cb4;
        test_read_num<double,int,int(*)(char_const**,double*)>
                  (-0x3039,mp_read_double_lossy,is_ok_36);
        pcStack_250 = (char *)0x135cc1;
        test_read_num<double,int,int(*)(char_const**,double*)>
                  (-0x75bcd15,mp_read_double_lossy,is_ok_37);
        pcStack_250 = (char *)0x135cd1;
        test_read_num<double,long_long,int(*)(char_const**,double*)>
                  (-0x11f71fb0450,mp_read_double_lossy,true);
        uVar17 = 200;
        pcStack_250 = (char *)0x135ce1;
        test_read_num<double,long_long,int(*)(char_const**,double*)>
                  (-0x1b69b4bacd05f15,mp_read_double_lossy,true);
        pcStack_250 = (char *)0x135ce9;
        test_read_num<double,float,int(*)(char_const**,double*)>
                  (num1_00,mp_read_double_lossy,(bool)uVar17);
        pcStack_250 = (char *)0x135cf1;
        test_read_num<double,double,int(*)(char_const**,double*)>
                  (num1_02,mp_read_double_lossy,(bool)uVar17);
        pcStack_250 = (char *)0x135cf9;
        test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>(mp_read_double_lossy)
        ;
        pcStack_250 = (char *)0x135d08;
        _space((FILE *)_stdout);
        pcStack_250 = (char *)0x135d1d;
        printf("# *** %s: done ***\n","test_mp_read_typed");
        pcStack_250 = (char *)0x135d22;
        iVar4 = check_plan();
        return iVar4;
      }
    } while( true );
  }
LAB_00135f19:
  data = (char *)&local_240;
  pcStack_250 = (char *)0x135f23;
  mp_decode_uint((char **)data);
LAB_00135f23:
  pcStack_250 = (char *)0x135f28;
  test_mp_read_typed();
LAB_00135f28:
  pcStack_250 = (char *)0x135f2d;
  test_mp_read_typed();
  goto LAB_00135f2d;
switchD_0013569b_default:
  if (0xdf < bVar2) {
LAB_00135f0f:
    pcStack_250 = (char *)0x135f14;
    test_mp_read_typed();
LAB_00135f14:
    pcStack_250 = (char *)0x135f19;
    test_mp_read_typed();
    goto LAB_00135f19;
  }
  goto LAB_00135f41;
LAB_00135e88:
  pcStack_250 = (char *)0x135e8d;
  test_mp_read_typed();
LAB_00135e8d:
  pcStack_250 = (char *)0x135e92;
  test_mp_read_typed();
LAB_00135e92:
  pcStack_250 = (char *)0x135e97;
  test_mp_read_typed();
LAB_00135e97:
  pcStack_250 = (char *)0x135e9c;
  test_mp_read_typed();
LAB_00135e9c:
  pcStack_250 = (char *)0x135ea1;
  test_mp_read_typed();
LAB_00135ea1:
  pcStack_250 = (char *)0x135ea6;
  test_mp_read_typed();
LAB_00135ea6:
  pcStack_250 = (char *)0x135ec5;
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0x933,"int64_t mp_decode_int(const char **)");
LAB_00135d39:
  pcVar24 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  mp_nums_00 = "check position";
  pcStack_250 = (char *)0x135d3e;
  test_mp_read_typed();
LAB_00135d3e:
  pcStack_250 = (char *)0x135d43;
  test_mp_read_typed();
  uVar20 = extraout_EAX;
LAB_00135d43:
  mVar6 = (uVar20 & 0xff) - 0xd0;
  if ((MP_INT < mVar6) && ((byte)uVar20 < 0xe0)) goto LAB_00135f14;
LAB_00135d59:
  pcStack_250 = (char *)0x135d5e;
  test_mp_read_typed();
  bVar2 = extraout_AL;
LAB_00135d5e:
  if (mVar6 != MP_UINT) {
    if (mVar6 == MP_FLOAT) {
      if (bVar2 != 0xca) {
LAB_00135d93:
        pcStack_250 = (char *)0x135db2;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar20 = *(uint *)(local_237 + (long)pcVar13);
      fVar5 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      if ((fVar5 != -9.223372e+18) || (NAN(fVar5))) {
        pcStack_250 = (char *)0x135d93;
        test_mp_read_typed();
        goto LAB_00135d93;
      }
    }
    else {
      if (bVar2 != 0xcb) goto LAB_00135e41;
      uVar8 = *(ulong *)(local_237 + (long)pcVar13);
      dVar7 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
      if ((dVar7 != -9.223372036854776e+18) || (NAN(dVar7))) goto LAB_00135ea1;
    }
LAB_00135e39:
    pcStack_250 = (char *)0x135e41;
    test_mp_read_typed();
LAB_00135e41:
    pcStack_250 = (char *)0x135e60;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
LAB_00135de8:
  if (bVar2 - 0xcc < 3) {
LAB_00135ec9:
    pcStack_250 = (char *)0x135ece;
    test_mp_read_typed();
LAB_00135ece:
    pcStack_250 = (char *)0x135eed;
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x8f7,"uint64_t mp_decode_uint_data(uint8_t, const char **)");
  }
  if (bVar2 == 0xcf) {
    if (*(long *)(local_237 + (long)pcVar13) == 0x100000000000080) goto LAB_00135e39;
    goto LAB_00135ec9;
  }
  if (-1 < (char)bVar2) goto LAB_00135ec9;
LAB_00135f2d:
  pcStack_250 = (char *)0x135f32;
  test_mp_read_typed();
LAB_00135f32:
  pcStack_250 = (char *)0x135f37;
  test_mp_read_typed();
LAB_00135f37:
  pcStack_250 = (char *)0x135f3c;
  test_mp_read_typed();
LAB_00135f3c:
  pcStack_250 = (char *)0x135f41;
  test_mp_read_typed();
LAB_00135f41:
  pcStack_250 = (char *)test_next_on_array;
  test_mp_read_typed();
  pcStack_278 = pcVar14;
  pcStack_270 = pcVar16;
  pcStack_268 = pcVar13;
  pcStack_260 = __maxlen;
  pcStack_258 = pcVar24;
  pcStack_250 = mp_nums_00;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  uVar20 = (uint)data;
  fprintf(_stdout,"next/check on array(%u)",(ulong)data & 0xffffffff);
  fputc(10,_stdout);
  if (uVar20 < 0x10) {
    buf[1] = (byte)data | 0x90;
    pcVar16 = buf + 2;
    if (uVar20 == 0) goto LAB_00136036;
  }
  else {
    if (uVar20 < 0x10000) {
      buf[1] = -0x24;
      uVar3 = (ushort)data << 8 | (ushort)data >> 8;
      buf[2] = (char)uVar3;
      buf[3] = (char)(uVar3 >> 8);
      lVar12 = 3;
    }
    else {
      buf[1] = -0x23;
      buf._2_4_ = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                  uVar20 << 0x18;
      lVar12 = 5;
    }
    pcVar16 = buf + lVar12 + 1;
  }
  uVar8 = 0;
  uVar11 = (ulong)data & 0xffffffff;
  do {
    iVar4 = (int)(uVar8 * 0x2040811 >> 0x20);
    uVar18 = ((uint)((int)uVar8 - iVar4) >> 1) + iVar4 >> 6;
    *pcVar16 = (char)uVar8 - ((char)(uVar18 << 7) - (char)uVar18);
    pcVar16 = pcVar16 + 1;
    uVar8 = (ulong)((int)uVar8 + 1);
    uVar18 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar18;
  } while (uVar18 != 0);
LAB_00136036:
  iVar4 = 1;
  if (0xf < uVar20) {
    iVar4 = (0xffff < uVar20) + 3 + (uint)(0xffff < uVar20);
  }
  uVar20 = iVar4 + uVar20;
  pbVar22 = (byte *)(ulong)uVar20;
  pcStack_280 = buf + 1;
  iVar4 = mp_check(&pcStack_280,::str);
  _ok((uint)(iVar4 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2a9,
      "mp_check(array %u))",(ulong)data & 0xffffffff);
  _ok((uint)((byte *)(pcVar16 + -0x15b121) == pbVar22),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2aa,
      "len(array %u) == %u",(ulong)data & 0xffffffff,uVar20);
  _ok((uint)((byte *)(pcStack_280 + -0x15b121) == pbVar22),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ab,
      "len(mp_check(array %u)) == %u",(ulong)data & 0xffffffff,uVar20);
  k = 1;
  pbStack_288 = (byte *)(buf + 1);
  do {
    pbVar10 = pbStack_288 + 1;
    lVar12 = (long)""[*pbStack_288];
    if (lVar12 < 0) {
      if (*pbStack_288 == 0xd9) {
        pbVar10 = pbStack_288 + (ulong)pbStack_288[1] + 2;
      }
      else {
        if ((byte)""[*pbStack_288] < 0xe1) {
          mp_next_slowpath((char **)&pbStack_288,k);
          break;
        }
        k = k - lVar12;
      }
    }
    else {
      pbVar10 = pbVar10 + lVar12;
    }
    bVar25 = 1 < k;
    k = k + -1;
    pbStack_288 = pbVar10;
  } while (bVar25);
  _ok((uint)(pbStack_288 + -0x15b121 == pbVar22),"(d3 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ad,
      "len(mp_next(array %u)) == %u",(ulong)data & 0xffffffff,uVar20);
  return extraout_EAX_01;
}

Assistant:

static int
test_mp_read_typed()
{
	plan(716);
	header();

	test_read_int8(12, true);
	test_read_int8(127, true);
	test_read_int8(128, false);
	test_read_int8(-12, true);
	test_read_int8(-128, true);
	test_read_int8(-129, false);
	test_read_int8(-3e-4f, false);
	test_read_int8(123.45, false);
	test_read_num_from_non_numeric_mp<int8_t>(mp_read_int8);

	test_read_int16(123, true);
	test_read_int16(32767, true);
	test_read_int16(32768, false);
	test_read_int16(-123, true);
	test_read_int16(-32768, true);
	test_read_int16(-32769, false);
	test_read_int16(-2e-3f, false);
	test_read_int16(12.345, false);
	test_read_num_from_non_numeric_mp<int16_t>(mp_read_int16);

	test_read_int32(123, true);
	test_read_int32(12345, true);
	test_read_int32(2147483647, true);
	test_read_int32(2147483648, false);
	test_read_int32(-123, true);
	test_read_int32(-12345, true);
	test_read_int32(-2147483648, true);
	test_read_int32(-2147483649LL, false);
	test_read_int32(-1e2f, false);
	test_read_int32(1.2345, false);
	test_read_num_from_non_numeric_mp<int32_t>(mp_read_int32);

	test_read_int64(123, true);
	test_read_int64(12345, true);
	test_read_int64(123456789, true);
	test_read_int64(9223372036854775807ULL, true);
	test_read_int64(9223372036854775808ULL, false);
	test_read_int64(-123, true);
	test_read_int64(-12345, true);
	test_read_int64(-123456789, true);
	test_read_int64(-9223372036854775807LL, true);
	test_read_int64(100.0f, false);
	test_read_int64(-5.4321, false);
	test_read_num_from_non_numeric_mp<int64_t>(mp_read_int64);

	test_read_double(123, true);
	test_read_double(12345, true);
	test_read_double(123456789, true);
	test_read_double(1234567890000ULL, true);
	test_read_double(123456789123456789ULL, false);
	test_read_double(-123, true);
	test_read_double(-12345, true);
	test_read_double(-123456789, true);
	test_read_double(-1234567890000LL, true);
	test_read_double(-123456789123456789LL, false);
	test_read_double(6.565e6f, true);
	test_read_double(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double);

	test_read_double_lossy(123, true);
	test_read_double_lossy(12345, true);
	test_read_double_lossy(123456789, true);
	test_read_double_lossy(1234567890000ULL, true);
	test_read_double_lossy(123456789123456789ULL, true);
	test_read_double_lossy(-123, true);
	test_read_double_lossy(-12345, true);
	test_read_double_lossy(-123456789, true);
	test_read_double_lossy(-1234567890000LL, true);
	test_read_double_lossy(-123456789123456789LL, true);
	test_read_double_lossy(6.565e6f, true);
	test_read_double_lossy(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double_lossy);

	footer();
	return check_plan();
}